

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O0

int largest(void)

{
  int local_10;
  int local_c;
  int big;
  int i;
  
  for (local_10 = 0; local_c = local_10, 1 < repeat[local_10]; local_10 = local_10 + 1) {
  }
  while (local_c = local_c + 1, local_c < popsize) {
    if ((storedd[local_10 * (numvars + 1) + numvars] <= storedd[local_c * (numvars + 1) + numvars])
       && (repeat[local_c] < 2)) {
      local_10 = local_c;
    }
  }
  return local_10;
}

Assistant:

static int
largest(void)
{
    int i;      /* loop var */
    int big;    /* temporary holder to return result */

    big = 0;
    while (repeat[big] > 1) big++;
    for (i = big + 1; i < popsize; i++) {
        if (STOREDD(i,numvars) >= STOREDD(big,numvars) && repeat[i] <= 1) {
            big = i;
        }
    }
    return(big);

}